

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O3

void __thiscall Fl_Spinner::Fl_Spinner(Fl_Spinner *this,int X,int Y,int W,int H,char *L)

{
  int X_00;
  int H_00;
  
  Fl_Widget::Fl_Widget((Fl_Widget *)this,X,Y,W,H,L);
  (this->super_Fl_Group).super_Fl_Widget.label_.align_ = 1;
  (this->super_Fl_Group).children_ = 0;
  (this->super_Fl_Group).array_ = (Fl_Widget **)0x0;
  (this->super_Fl_Group).savedfocus_ = (Fl_Widget *)0x0;
  (this->super_Fl_Group).resizable_ = (Fl_Widget *)this;
  (this->super_Fl_Group).sizes_ = (int *)0x0;
  Fl_Group::current_ = &this->super_Fl_Group;
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Spinner_002776f8;
  H_00 = H / 2;
  Fl_Input::Fl_Input(&this->input_,X,Y,(W - H_00) + -2,H,(char *)0x0);
  X_00 = ((X + W) - H_00) + -2;
  Fl_Repeat_Button::Fl_Repeat_Button(&this->up_button_,X_00,Y,H_00 + 2,H_00,"@-42<");
  Fl_Repeat_Button::Fl_Repeat_Button(&this->down_button_,X_00,(H + Y) - H_00,H_00 + 2,H_00,"@-42>");
  Fl_Group::current_ = (this->super_Fl_Group).super_Fl_Widget.parent_;
  this->value_ = 1.0;
  this->minimum_ = 1.0;
  this->maximum_ = 100.0;
  this->step_ = 1.0;
  this->format_ = "%g";
  (this->super_Fl_Group).super_Fl_Widget.label_.align_ = 4;
  Fl_Input_::value(&(this->input_).super_Fl_Input_,"1");
  (this->input_).super_Fl_Input_.super_Fl_Widget.type_ = '\x02';
  (this->input_).super_Fl_Input_.super_Fl_Widget.when_ = '\f';
  (this->input_).super_Fl_Input_.super_Fl_Widget.callback_ = sb_cb;
  (this->input_).super_Fl_Input_.super_Fl_Widget.user_data_ = this;
  (this->up_button_).super_Fl_Button.super_Fl_Widget.callback_ = sb_cb;
  (this->up_button_).super_Fl_Button.super_Fl_Widget.user_data_ = this;
  (this->down_button_).super_Fl_Button.super_Fl_Widget.callback_ = sb_cb;
  (this->down_button_).super_Fl_Button.super_Fl_Widget.user_data_ = this;
  return;
}

Assistant:

Fl_Spinner::Fl_Spinner(int X, int Y, int W, int H, const char *L)
: Fl_Group(X, Y, W, H, L),
  input_(X, Y, W - H / 2 - 2, H),
  up_button_(X + W - H / 2 - 2, Y, H / 2 + 2, H / 2, "@-42<"),
  down_button_(X + W - H / 2 - 2, Y + H - H / 2,
               H / 2 + 2, H / 2, "@-42>") 
{
  end();
  
  value_   = 1.0;
  minimum_ = 1.0;
  maximum_ = 100.0;
  step_    = 1.0;
  format_  = "%g";
  
  align(FL_ALIGN_LEFT);
  
  input_.value("1");
  input_.type(FL_INT_INPUT);
  input_.when(FL_WHEN_ENTER_KEY | FL_WHEN_RELEASE);
  input_.callback((Fl_Callback *)sb_cb, this);
  
  up_button_.callback((Fl_Callback *)sb_cb, this);
  
  down_button_.callback((Fl_Callback *)sb_cb, this);
}